

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g12s.c
# Opt level: O0

err_t g12sParamsStd(g12s_params *params,char *name)

{
  bool_t bVar1;
  int iVar2;
  char *in_RSI;
  char *in_RDI;
  err_t local_4;
  
  bVar1 = memIsValid(in_RDI,0x19c);
  if (bVar1 == 0) {
    local_4 = 0x6d;
  }
  else {
    memSet(in_RDI,(octet)((ulong)in_RSI >> 0x38),0x16614f);
    iVar2 = strCmp(in_RDI,in_RSI);
    if (iVar2 == 0) {
      in_RDI[0] = '\0';
      in_RDI[1] = '\x01';
      in_RDI[2] = '\0';
      in_RDI[3] = '\0';
      memCopy(in_RDI,in_RSI,0x16618d);
      memCopy(in_RDI,in_RSI,0x1661a7);
      memCopy(in_RDI,in_RSI,0x1661c4);
      memCopy(in_RDI,in_RSI,0x1661e1);
      in_RDI[0x110] = '\x01';
      in_RDI[0x111] = '\0';
      in_RDI[0x112] = '\0';
      in_RDI[0x113] = '\0';
      memCopy(in_RDI,in_RSI,0x16620d);
      memCopy(in_RDI,in_RSI,0x16622a);
      local_4 = 0;
    }
    else {
      iVar2 = strCmp(in_RDI,in_RSI);
      if (iVar2 == 0) {
        in_RDI[0] = '\0';
        in_RDI[1] = '\x01';
        in_RDI[2] = '\0';
        in_RDI[3] = '\0';
        memCopy(in_RDI,in_RSI,0x166275);
        memCopy(in_RDI,in_RSI,0x16628f);
        memCopy(in_RDI,in_RSI,0x1662ac);
        memCopy(in_RDI,in_RSI,0x1662c9);
        in_RDI[0x110] = '\x01';
        in_RDI[0x111] = '\0';
        in_RDI[0x112] = '\0';
        in_RDI[0x113] = '\0';
        memCopy(in_RDI,in_RSI,0x1662f5);
        memCopy(in_RDI,in_RSI,0x166312);
        local_4 = 0;
      }
      else {
        iVar2 = strCmp(in_RDI,in_RSI);
        if (iVar2 == 0) {
          in_RDI[0] = '\0';
          in_RDI[1] = '\x01';
          in_RDI[2] = '\0';
          in_RDI[3] = '\0';
          memCopy(in_RDI,in_RSI,0x16635d);
          memCopy(in_RDI,in_RSI,0x166377);
          memCopy(in_RDI,in_RSI,0x166394);
          memCopy(in_RDI,in_RSI,0x1663b1);
          in_RDI[0x110] = '\x01';
          in_RDI[0x111] = '\0';
          in_RDI[0x112] = '\0';
          in_RDI[0x113] = '\0';
          memCopy(in_RDI,in_RSI,0x1663dd);
          memCopy(in_RDI,in_RSI,0x1663fa);
          local_4 = 0;
        }
        else {
          iVar2 = strCmp(in_RDI,in_RSI);
          if (iVar2 == 0) {
            in_RDI[0] = '\0';
            in_RDI[1] = '\x01';
            in_RDI[2] = '\0';
            in_RDI[3] = '\0';
            memCopy(in_RDI,in_RSI,0x166445);
            memCopy(in_RDI,in_RSI,0x16645f);
            memCopy(in_RDI,in_RSI,0x16647c);
            memCopy(in_RDI,in_RSI,0x166499);
            in_RDI[0x110] = '\x01';
            in_RDI[0x111] = '\0';
            in_RDI[0x112] = '\0';
            in_RDI[0x113] = '\0';
            memCopy(in_RDI,in_RSI,0x1664c5);
            memCopy(in_RDI,in_RSI,0x1664e2);
            local_4 = 0;
          }
          else {
            iVar2 = strCmp(in_RDI,in_RSI);
            if (iVar2 == 0) {
              in_RDI[0] = '\0';
              in_RDI[1] = '\x01';
              in_RDI[2] = '\0';
              in_RDI[3] = '\0';
              memCopy(in_RDI,in_RSI,0x16652d);
              memCopy(in_RDI,in_RSI,0x166547);
              memCopy(in_RDI,in_RSI,0x166564);
              memCopy(in_RDI,in_RSI,0x166581);
              in_RDI[0x110] = '\x02';
              in_RDI[0x111] = '\0';
              in_RDI[0x112] = '\0';
              in_RDI[0x113] = '\0';
              memCopy(in_RDI,in_RSI,0x1665ad);
              memCopy(in_RDI,in_RSI,0x1665ca);
              local_4 = 0;
            }
            else {
              iVar2 = strCmp(in_RDI,in_RSI);
              if (iVar2 == 0) {
                in_RDI[0] = '\0';
                in_RDI[1] = '\x02';
                in_RDI[2] = '\0';
                in_RDI[3] = '\0';
                memCopy(in_RDI,in_RSI,0x166615);
                memCopy(in_RDI,in_RSI,0x16662f);
                memCopy(in_RDI,in_RSI,0x16664c);
                memCopy(in_RDI,in_RSI,0x166669);
                in_RDI[0x110] = '\x01';
                in_RDI[0x111] = '\0';
                in_RDI[0x112] = '\0';
                in_RDI[0x113] = '\0';
                memCopy(in_RDI,in_RSI,0x166695);
                memCopy(in_RDI,in_RSI,0x1666b2);
                local_4 = 0;
              }
              else {
                iVar2 = strCmp(in_RDI,in_RSI);
                if (iVar2 == 0) {
                  in_RDI[0] = '\0';
                  in_RDI[1] = '\x02';
                  in_RDI[2] = '\0';
                  in_RDI[3] = '\0';
                  memCopy(in_RDI,in_RSI,0x1666fd);
                  memCopy(in_RDI,in_RSI,0x166717);
                  memCopy(in_RDI,in_RSI,0x166734);
                  memCopy(in_RDI,in_RSI,0x166751);
                  in_RDI[0x110] = '\x01';
                  in_RDI[0x111] = '\0';
                  in_RDI[0x112] = '\0';
                  in_RDI[0x113] = '\0';
                  memCopy(in_RDI,in_RSI,0x16677d);
                  memCopy(in_RDI,in_RSI,0x16679a);
                  local_4 = 0;
                }
                else {
                  iVar2 = strCmp(in_RDI,in_RSI);
                  if (iVar2 == 0) {
                    in_RDI[0] = '\0';
                    in_RDI[1] = '\x02';
                    in_RDI[2] = '\0';
                    in_RDI[3] = '\0';
                    memCopy(in_RDI,in_RSI,0x1667e5);
                    memCopy(in_RDI,in_RSI,0x1667ff);
                    memCopy(in_RDI,in_RSI,0x16681c);
                    memCopy(in_RDI,in_RSI,0x166839);
                    in_RDI[0x110] = '\x01';
                    in_RDI[0x111] = '\0';
                    in_RDI[0x112] = '\0';
                    in_RDI[0x113] = '\0';
                    memCopy(in_RDI,in_RSI,0x166865);
                    memCopy(in_RDI,in_RSI,0x166882);
                    local_4 = 0;
                  }
                  else {
                    local_4 = 0xca;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

err_t g12sParamsStd(g12s_params* params, const char* name)
{
	if (!memIsValid(params, sizeof(g12s_params)))
		return ERR_BAD_INPUT;
	memSetZero(params, sizeof(g12s_params));
	if (strEq(name, _a1_name))
	{
		_LOAD_NAMED_PARAMS(params, a1);
		return ERR_OK;
	}
	if (strEq(name, _cryptoproA_name))
	{
		_LOAD_NAMED_PARAMS(params, cryptoproA);
		return ERR_OK;
	}
	if (strEq(name, _cryptoproB_name))
	{
		_LOAD_NAMED_PARAMS(params, cryptoproB);
		return ERR_OK;
	}
	if (strEq(name, _cryptoproC_name))
	{
		_LOAD_NAMED_PARAMS(params, cryptoproC);
		return ERR_OK;
	}
	if (strEq(name, _cryptocom_name))
	{
		_LOAD_NAMED_PARAMS(params, cryptocom);
		return ERR_OK;
	}
	if (strEq(name, _a2_name))
	{
		_LOAD_NAMED_PARAMS(params, a2);
		return ERR_OK;
	}
	if (strEq(name, _paramsetA512_name))
	{
		_LOAD_NAMED_PARAMS(params, paramsetA512);
		return ERR_OK;
	}
	if (strEq(name, _paramsetB512_name))
	{
		_LOAD_NAMED_PARAMS(params, paramsetB512);
		return ERR_OK;
	}
	return ERR_FILE_NOT_FOUND;
}